

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  byte bVar2;
  char **ppcVar3;
  int iVar4;
  XML_Convert_Result XVar5;
  ulong uVar6;
  char **ppcVar7;
  unsigned_short **ppuVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  unsigned_short *in_R8;
  char **ppcStack_40;
  
  uVar6 = (long)end - (long)ptr;
  if ((long)uVar6 < 1) {
    return -1;
  }
  cVar1 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  ppcVar3 = (char **)0x1;
  ppcStack_40 = ppcVar3;
  switch(cVar1) {
  case '\x05':
    if (uVar6 == 1) {
      return -2;
    }
    ppcVar7 = ppcVar3;
    iVar4 = (*enc[3].literalScanners[0])
                      (enc,ptr,(char *)&switchD_0017268b::switchdataD_001b2eb4,(char **)0x1);
    if ((iVar4 == 0) && (iVar4 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX,ppcVar7), iVar4 != 0)) {
      ppcStack_40 = (char **)0x2;
      goto switchD_0017268b_caseD_16;
    }
    break;
  case '\x06':
    if (uVar6 < 3) {
      return -2;
    }
    ppcVar7 = ppcVar3;
    iVar4 = (*enc[3].literalScanners[1])
                      (enc,ptr,(char *)&switchD_0017268b::switchdataD_001b2eb4,(char **)0x1);
    if (iVar4 == 0) {
      iVar4 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_01,ppcVar7);
      ppcStack_40 = (char **)0x3;
LAB_00172738:
      if (iVar4 != 0) {
switchD_0017268b_caseD_16:
        ptr = ptr + (long)ppcStack_40;
        do {
          uVar6 = (long)end - (long)ptr;
          if ((long)uVar6 < 1) {
            return -1;
          }
          bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
          ppuVar8 = (unsigned_short **)(ulong)bVar2;
          ppcStack_40 = ppcVar3;
          if (3 < bVar2 - 0x18) {
            if (bVar2 == 5) {
              if (uVar6 == 1) {
                return -2;
              }
              iVar4 = (*enc[3].literalScanners[0])(enc,ptr,(char *)0x1,(char **)ppuVar8);
              if (iVar4 != 0) break;
              XVar5 = (*enc[2].utf16Convert)(enc,(char **)ptr,extraout_RDX_02,ppuVar8,in_R8);
              ppcStack_40 = (char **)0x2;
            }
            else if (bVar2 == 6) {
              if (uVar6 < 3) {
                return -2;
              }
              iVar4 = (*enc[3].literalScanners[1])(enc,ptr,(char *)0x1,(char **)ppuVar8);
              if (iVar4 != 0) break;
              XVar5 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
              ppcStack_40 = (char **)0x3;
            }
            else {
              if (bVar2 != 7) {
                if (bVar2 == 0x16) goto LAB_00172820;
                if (bVar2 != 0x12) break;
                ptr = (char *)((long)ptr + 1);
                iVar4 = 0x1c;
                goto LAB_00172839;
              }
              if (uVar6 < 4) {
                return -2;
              }
              iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,(char *)0x1,(char *)ppuVar8);
              if (iVar4 != 0) break;
              XVar5 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_03,(char **)ppuVar8);
              ppcStack_40 = (char **)0x4;
            }
            if (XVar5 == XML_CONVERT_COMPLETED) break;
          }
LAB_00172820:
          ptr = (char *)((long)ptr + (long)ppcStack_40);
        } while( true );
      }
    }
    break;
  case '\a':
    if (uVar6 < 4) {
      return -2;
    }
    ppcVar7 = ppcVar3;
    iVar4 = (*enc[3].nameMatchesAscii)
                      (enc,ptr,(char *)&switchD_0017268b::switchdataD_001b2eb4,(char *)0x1);
    if (iVar4 == 0) {
      iVar4 = (*enc[3].scanners[3])(enc,ptr,extraout_RDX_00,ppcVar7);
      ppcStack_40 = (char **)0x4;
      goto LAB_00172738;
    }
    break;
  case '\b':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x14':
  case '\x17':
    break;
  case '\t':
  case '\n':
  case '\x15':
switchD_0017268b_caseD_9:
    iVar4 = 0x16;
    goto LAB_00172839;
  case '\x16':
  case '\x18':
    goto switchD_0017268b_caseD_16;
  default:
    if (cVar1 == '\x1e') goto switchD_0017268b_caseD_9;
  }
  iVar4 = 0;
LAB_00172839:
  *nextTokPtr = ptr;
  return iVar4;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S:
  case BT_LF:
  case BT_CR:
  case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}